

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O3

int cli::pack(Parser *parse,Option *options)

{
  char *__s;
  bool bVar1;
  Compression compression;
  long lVar2;
  string outPath;
  string path;
  ArchiveBuilder archive;
  allocator<char> local_b1;
  string local_b0;
  Option *local_90;
  Descriptor *local_88;
  string local_80;
  ArchiveBuilder local_60;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"./archive.zap","");
  __s = options[4].arg;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,(char *)local_b0._M_string_length,(ulong)__s);
  }
  local_88 = options[6].desc;
  local_90 = options;
  ZAP::ArchiveBuilder::ArchiveBuilder(&local_60);
  if (0 < parse->nonop_count) {
    lVar2 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,parse->nonop_args[lVar2],&local_b1);
      cleanPath(&local_80);
      bVar1 = isDirectory(&local_80);
      if (bVar1) {
        anon_unknown_1::addDirectory(&local_60,&local_80,local_88 != (Descriptor *)0x0);
      }
      else {
        ZAP::ArchiveBuilder::addFile(&local_60,&local_80,&local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < parse->nonop_count);
  }
  if (local_90[5].arg == (char *)0x0) {
    compression = NONE;
  }
  else {
    compression = atoi(local_90[5].arg);
  }
  bVar1 = ZAP::ArchiveBuilder::buildFile(&local_60,&local_b0,compression);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not build archive",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  ZAP::ArchiveBuilder::~ArchiveBuilder(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return (uint)!bVar1;
}

Assistant:

int pack(option::Parser &parse, option::Option *options)
	{
		std::string outPath = "./archive.zap";
		if (options[PACK].arg != nullptr)
			outPath = options[PACK].arg;

		bool recursive = (options[RECURSIVE] != nullptr);

		ZAP::ArchiveBuilder archive;

		for (int i = 0; i < parse.nonOptionsCount(); ++i)
		{
			std::string path = parse.nonOption(i);
			cleanPath(path);

			if (isDirectory(path))
				addDirectory(archive, path, recursive);
			else
				addPath(archive, path);
		}

		ZAP::Compression compression = ZAP::Compression::NONE;
		if (options[COMPRESS].arg != nullptr)
			compression = static_cast<ZAP::Compression>(std::atoi(options[COMPRESS].arg));

		if (!archive.buildFile(outPath, compression))
		{
			std::cerr << "Could not build archive" << std::endl;
			return 1;
		}

		return 0;
	}